

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_FundRawTransaction_MinBits36_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_MinBits36_Test *this)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  reference pvVar4;
  string *psVar5;
  char *pcVar6;
  size_type sVar7;
  char *pcVar8;
  char *pcVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_bool>
  pVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar11;
  AssertionResult gtest_ar_6;
  CfdException *except;
  AssertionResult gtest_ar_5;
  ConfidentialTxInReference *txin;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  *__range1_1;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  ConfidentialTransactionContext context;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ConfidentialTransactionController ctx;
  ElementsTransactionApi api;
  CoinSelectionOption option;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  UtxoFilter filter;
  Amount estimate_fee;
  double fee_rate;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  ElementsConfidentialAddress reserve_ct_addr2;
  ElementsConfidentialAddress reserve_ct_addr1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  Address addr2;
  Address addr1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  ConfidentialAssetId fee_asset;
  ElementsConfidentialAddress ct_addr4;
  ElementsConfidentialAddress ct_addr3;
  ElementsConfidentialAddress ct_addr2;
  ElementsConfidentialAddress ct_addr1;
  Address set_addr4;
  Address set_addr3;
  Address set_addr2;
  Address set_addr1;
  ExtPubkey key;
  Txid txid;
  TestFundElementsUtxoVector *test_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *__range1;
  uint32_t i;
  string descMulti;
  ElementsAddressFactory factory;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext tx;
  ConfidentialAssetId *in_stack_ffffffffffffdc28;
  AbstractTxInReference *this_00;
  ConfidentialTransactionContext *in_stack_ffffffffffffdc30;
  ElementsConfidentialAddress *this_01;
  undefined4 in_stack_ffffffffffffdc38;
  undefined4 uVar12;
  undefined4 in_stack_ffffffffffffdc3c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffdc40;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_02;
  size_type in_stack_ffffffffffffdc48;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffdc50;
  undefined8 in_stack_ffffffffffffdc68;
  NetType type;
  ElementsAddressFactory *in_stack_ffffffffffffdc70;
  vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *in_stack_ffffffffffffdc80;
  undefined8 in_stack_ffffffffffffdc88;
  undefined7 in_stack_ffffffffffffdc90;
  undefined1 in_stack_ffffffffffffdc97;
  undefined4 in_stack_ffffffffffffdc98;
  undefined4 in_stack_ffffffffffffdc9c;
  undefined4 in_stack_ffffffffffffdca0;
  undefined4 in_stack_ffffffffffffdca4;
  undefined1 in_stack_ffffffffffffdd07;
  ConfidentialAssetId *in_stack_ffffffffffffdd08;
  undefined7 in_stack_ffffffffffffdd10;
  undefined1 in_stack_ffffffffffffdd17;
  ElementsConfidentialAddress *in_stack_ffffffffffffdd18;
  ConfidentialTransactionContext *in_stack_ffffffffffffdd20;
  AssertHelper local_2238;
  Message local_2230;
  uint32_t local_2228;
  undefined4 local_2224;
  AssertionResult local_2220;
  SigHashType local_2210;
  allocator local_2201;
  string local_2200;
  Privkey local_21e0;
  allocator local_21b9;
  string local_21b8;
  Pubkey local_2198;
  Txid local_2180;
  OutPoint local_2160;
  reference local_2138;
  ConfidentialTxInReference *local_2130;
  __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
  local_2128;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  local_2120;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  *local_2108;
  string local_20e8 [32];
  ConfidentialTransaction local_20c8;
  CoinSelectionOption *in_stack_ffffffffffffdf90;
  AssertHelper local_2010;
  Message local_2008;
  string local_2000;
  AssertionResult local_1fe0;
  AssertHelper local_1fd0;
  Message local_1fc8;
  string local_1fc0;
  AssertionResult local_1fa0;
  AssertHelper local_1f90;
  Message local_1f88;
  size_type local_1f80;
  undefined8 local_1f78;
  AssertionResult local_1f70;
  AssertHelper local_1f60;
  Message local_1f58;
  int64_t local_1f50;
  undefined4 local_1f44;
  AssertionResult local_1f40;
  AssertHelper local_1f30;
  Message local_1f28;
  string local_1f20 [32];
  AssertionResult local_1f00;
  string local_1ef0 [3];
  ElementsTransactionApi local_1e79 [88];
  undefined1 in_stack_ffffffffffffe1df;
  SigHashType *in_stack_ffffffffffffe1e0;
  Privkey *in_stack_ffffffffffffe1e8;
  pointer in_stack_ffffffffffffe1f0;
  OutPoint *in_stack_ffffffffffffe1f8;
  ConfidentialTransactionContext *in_stack_ffffffffffffe200;
  char local_1df4 [4];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_1df0 [2];
  ExtPubkey local_1dc0;
  Pubkey local_1d50;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffe2d8;
  ConfidentialTransactionContext *in_stack_ffffffffffffe2e0;
  ExtPubkey local_1b88;
  Pubkey local_1b18;
  ElementsConfidentialAddress local_1b00;
  _Base_ptr local_1950;
  undefined1 local_1948;
  string local_1940;
  string local_1920;
  _Base_ptr local_1900;
  undefined1 local_18f8;
  string local_18f0;
  string local_18d0;
  undefined1 local_18b0 [160];
  Pubkey local_1810;
  Address local_17f8;
  ExtPubkey local_1680;
  Pubkey local_1610;
  Address local_15f8;
  _Base_ptr local_1480;
  undefined1 local_1478;
  Amount local_1470;
  string local_1460;
  _Base_ptr local_1440;
  undefined1 local_1438;
  Amount local_1430;
  string local_1420 [2];
  undefined1 local_13d0 [72];
  Amount local_1388;
  Amount local_1378;
  ExtPubkey local_1368;
  Pubkey local_12f8;
  ElementsConfidentialAddress local_12e0;
  ExtPubkey local_1130;
  pointer in_stack_ffffffffffffef50;
  undefined1 in_stack_ffffffffffffef5f;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  *in_stack_ffffffffffffef60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  *in_stack_ffffffffffffef68;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffef70;
  undefined8 in_stack_ffffffffffffef78;
  undefined8 in_stack_ffffffffffffef80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffefa0;
  ConfidentialAssetId *in_stack_ffffffffffffefa8;
  Amount *in_stack_ffffffffffffefb8;
  UtxoFilter *in_stack_ffffffffffffefc0;
  CoinSelectionOption *in_stack_ffffffffffffefc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffefd0;
  NetType_conflict in_stack_ffffffffffffefd8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_ffffffffffffefe0;
  Amount *in_stack_ffffffffffffefe8;
  ExtPubkey local_ef8;
  Pubkey local_e88;
  ElementsConfidentialAddress local_e70;
  ExtPubkey local_cc0;
  Pubkey local_c50;
  ElementsConfidentialAddress local_c38;
  ExtPubkey local_a88;
  Pubkey local_a18;
  Address local_a00;
  ExtPubkey local_888;
  Pubkey local_818;
  Address local_800;
  ExtPubkey local_688;
  Pubkey local_618;
  Address local_600;
  ExtPubkey local_488;
  Pubkey local_418;
  Address local_400;
  allocator local_281;
  string local_280;
  ExtPubkey local_260;
  ConfidentialAssetId local_1f0;
  Amount local_1c8;
  Txid local_1b8;
  Txid local_198;
  Txid local_178;
  reference local_158;
  TestFundElementsUtxoVector *local_150;
  __normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
  local_148;
  vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *local_140;
  uint local_138;
  allocator local_131;
  string local_130 [88];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_d8;
  AbstractTransaction local_c0 [12];
  
  type = (NetType)((ulong)in_stack_ffffffffffffdc68 >> 0x20);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (in_stack_ffffffffffffdc30,(uint32_t)((ulong)in_stack_ffffffffffffdc28 >> 0x20),
             (uint32_t)in_stack_ffffffffffffdc28);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x2cc350);
  cfd::ElementsAddressFactory::ElementsAddressFactory(in_stack_ffffffffffffdc70,type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_130,
             "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))"
             ,&local_131);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::size
            (&kFundCoinSelectElementsTestVector2);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::resize
            (in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc48);
  local_138 = 0;
  local_140 = &kFundCoinSelectElementsTestVector2;
  local_148._M_current =
       (TestFundElementsUtxoVector *)
       std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::begin
                 ((vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *
                  )in_stack_ffffffffffffdc28);
  local_150 = (TestFundElementsUtxoVector *)
              std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::
              end((vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *
                  )in_stack_ffffffffffffdc28);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
                             *)in_stack_ffffffffffffdc30,
                            (__normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
                             *)in_stack_ffffffffffffdc28), bVar1) {
    local_158 = __gnu_cxx::
                __normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
                ::operator*(&local_148);
    cfd::core::Txid::Txid(&local_178);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cfd::core::Txid::Txid(&local_198,&local_158->txid);
      cfd::core::Txid::operator=(&local_178,&local_198);
      cfd::core::Txid::~Txid((Txid *)0x2cc496);
    }
    cfd::core::Txid::Txid(&local_1b8,&local_158->txid);
    pvVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_d8,(ulong)local_138);
    cfd::core::Txid::operator=(&pvVar4->txid,&local_1b8);
    cfd::core::Txid::~Txid((Txid *)0x2cc582);
    uVar2 = local_158->vout;
    pvVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_d8,(ulong)local_138);
    pvVar4->vout = uVar2;
    cfd::core::Amount::Amount(&local_1c8,local_158->amount);
    pvVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_d8,(ulong)local_138);
    (pvVar4->amount).ignore_check_ = local_1c8.ignore_check_;
    (pvVar4->amount).amount_ = local_1c8.amount_;
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1f0,&local_158->asset);
    pvVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_d8,(ulong)local_138);
    cfd::core::ConfidentialAssetId::operator=(&pvVar4->asset,&local_1f0);
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2cc658);
    psVar5 = &local_158->descriptor;
    pvVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_d8,(ulong)local_138);
    std::__cxx11::string::operator=((string *)&pvVar4->descriptor,(string *)psVar5);
    pvVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_d8,(ulong)local_138);
    pvVar4->address_type = kP2shP2wpkhAddress;
    local_138 = local_138 + 1;
    cfd::core::Txid::~Txid((Txid *)0x2cc6d9);
    __gnu_cxx::
    __normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
    ::operator++(&local_148);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_280,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,&local_281);
  cfd::core::ExtPubkey::ExtPubkey(&local_260,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  cfd::core::ExtPubkey::DerivePubkey(&local_488,&local_260,0xb);
  cfd::core::ExtPubkey::GetPubkey(&local_418,&local_488);
  cfd::AddressFactory::CreateP2wpkhAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffdc3c,in_stack_ffffffffffffdc38),
             (Pubkey *)in_stack_ffffffffffffdc30);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2cc804);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffdc30);
  cfd::core::ExtPubkey::DerivePubkey(&local_688,&local_260,0xc);
  cfd::core::ExtPubkey::GetPubkey(&local_618,&local_688);
  cfd::AddressFactory::CreateP2wpkhAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffdc3c,in_stack_ffffffffffffdc38),
             (Pubkey *)in_stack_ffffffffffffdc30);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2cc870);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffdc30);
  cfd::core::ExtPubkey::DerivePubkey(&local_888,&local_260,0xd);
  cfd::core::ExtPubkey::GetPubkey(&local_818,&local_888);
  cfd::AddressFactory::CreateP2wpkhAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffdc3c,in_stack_ffffffffffffdc38),
             (Pubkey *)in_stack_ffffffffffffdc30);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2cc8dc);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffdc30);
  cfd::core::ExtPubkey::DerivePubkey(&local_a88,&local_260,0xe);
  cfd::core::ExtPubkey::GetPubkey(&local_a18,&local_a88);
  cfd::AddressFactory::CreateP2wpkhAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffdc3c,in_stack_ffffffffffffdc38),
             (Pubkey *)in_stack_ffffffffffffdc30);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2cc948);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffdc30);
  cfd::core::ExtPubkey::DerivePubkey(&local_cc0,&local_260,0x6f);
  cfd::core::ExtPubkey::GetPubkey(&local_c50,&local_cc0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_c38,&local_400,&local_c50);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2cc9b4);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffdc30);
  cfd::core::ExtPubkey::DerivePubkey(&local_ef8,&local_260,0x70);
  cfd::core::ExtPubkey::GetPubkey(&local_e88,&local_ef8);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_e70,&local_600,&local_e88);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2cca20);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffdc30);
  cfd::core::ExtPubkey::DerivePubkey(&local_1130,&local_260,0x71);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)&stack0xffffffffffffef40,&local_1130);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&stack0xffffffffffffef58,&local_800,
             (ConfidentialKey *)&stack0xffffffffffffef40);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2cca8c);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffdc30);
  cfd::core::ExtPubkey::DerivePubkey(&local_1368,&local_260,0x72);
  cfd::core::ExtPubkey::GetPubkey(&local_12f8,&local_1368);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_12e0,&local_a00,&local_12f8);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2ccaf8);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffdc30);
  cfd::core::Amount::Amount(&local_1378,300000000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd18,
             (Amount *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10),
             in_stack_ffffffffffffdd08,(bool)in_stack_ffffffffffffdd07);
  cfd::core::Amount::Amount(&local_1388,50000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd18,
             (Amount *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10),
             in_stack_ffffffffffffdd08,(bool)in_stack_ffffffffffffdd07);
  cfd::core::Amount::Amount((Amount *)(local_13d0 + 0x38),50000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd18,
             (Amount *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10),
             in_stack_ffffffffffffdd08,(bool)in_stack_ffffffffffffdd07);
  cfd::core::Amount::Amount((Amount *)(local_13d0 + 0x28),50000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd18,
             (Amount *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10),
             in_stack_ffffffffffffdd08,(bool)in_stack_ffffffffffffdd07);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_13d0,&exp_dummy_asset_a);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
         *)0x2ccc30);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(local_1420,&exp_dummy_asset_a);
  cfd::core::Amount::Amount(&local_1430,0);
  pVar10 = std::
           map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
           ::emplace<std::__cxx11::string,cfd::core::Amount>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                       *)in_stack_ffffffffffffdc40,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffdc3c,in_stack_ffffffffffffdc38),
                      (Amount *)in_stack_ffffffffffffdc30);
  local_1440 = (_Base_ptr)pVar10.first._M_node;
  local_1438 = pVar10.second;
  std::__cxx11::string::~string((string *)local_1420);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_1460,&exp_dummy_asset_b);
  cfd::core::Amount::Amount(&local_1470,0);
  pVar10 = std::
           map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
           ::emplace<std::__cxx11::string,cfd::core::Amount>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                       *)in_stack_ffffffffffffdc40,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffdc3c,in_stack_ffffffffffffdc38),
                      (Amount *)in_stack_ffffffffffffdc30);
  local_1480 = (_Base_ptr)pVar10.first._M_node;
  local_1478 = pVar10.second;
  std::__cxx11::string::~string((string *)&local_1460);
  cfd::core::ExtPubkey::DerivePubkey(&local_1680,&local_260,1);
  cfd::core::ExtPubkey::GetPubkey(&local_1610,&local_1680);
  cfd::AddressFactory::CreateP2wpkhAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffdc3c,in_stack_ffffffffffffdc38),
             (Pubkey *)in_stack_ffffffffffffdc30);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2ccd93);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffdc30);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)(local_18b0 + 0x30),&local_260,2);
  cfd::core::ExtPubkey::GetPubkey(&local_1810,(ExtPubkey *)(local_18b0 + 0x30));
  cfd::AddressFactory::CreateP2wpkhAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffdc3c,in_stack_ffffffffffffdc38),
             (Pubkey *)in_stack_ffffffffffffdc30);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2ccdff);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffdc30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x2cce19);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_18d0,&exp_dummy_asset_a);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_18f0,&local_15f8);
  pVar11 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::emplace<std::__cxx11::string,std::__cxx11::string>
                     (in_stack_ffffffffffffdc40,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffdc3c,in_stack_ffffffffffffdc38),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffdc30);
  local_1900 = (_Base_ptr)pVar11.first._M_node;
  local_18f8 = pVar11.second;
  std::__cxx11::string::~string((string *)&local_18f0);
  std::__cxx11::string::~string((string *)&local_18d0);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_1920,&exp_dummy_asset_b);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_1940,&local_17f8);
  pVar11 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::emplace<std::__cxx11::string,std::__cxx11::string>
                     (in_stack_ffffffffffffdc40,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffdc3c,in_stack_ffffffffffffdc38),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffdc30);
  local_1950 = (_Base_ptr)pVar11.first._M_node;
  local_1948 = pVar11.second;
  std::__cxx11::string::~string((string *)&local_1940);
  std::__cxx11::string::~string((string *)&local_1920);
  cfd::core::ExtPubkey::DerivePubkey(&local_1b88,&local_260,0x5b);
  cfd::core::ExtPubkey::GetPubkey(&local_1b18,&local_1b88);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_1b00,&local_15f8,&local_1b18);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2ccf9e);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffdc30);
  cfd::core::ExtPubkey::DerivePubkey(&local_1dc0,&local_260,0x5c);
  cfd::core::ExtPubkey::GetPubkey(&local_1d50,&local_1dc0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&stack0xffffffffffffe2c8,&local_17f8,&local_1d50);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2cd00a);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffdc30);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)0x2cd024);
  local_1df0[0].super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3fb999999999999a;
  cfd::core::Amount::Amount((Amount *)local_1df0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2cd052);
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)in_stack_ffffffffffffdc30);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(in_stack_ffffffffffffdf90);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate
            ((CoinSelectionOption *)in_stack_ffffffffffffdc30,(double)in_stack_ffffffffffffdc28);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate
            ((CoinSelectionOption *)in_stack_ffffffffffffdc30,(double)in_stack_ffffffffffffdc28);
  cfd::CoinSelectionOption::SetFeeAsset
            ((CoinSelectionOption *)in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc28);
  cfd::CoinSelectionOption::SetBlindInfo((CoinSelectionOption *)(local_1e79 + 1),0,0x24);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(local_1e79);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(local_1ef0,local_c0);
  pcVar9 = local_1df4;
  this_02 = local_1df0;
  this_01 = (ElementsConfidentialAddress *)local_13d0;
  this_00 = (AbstractTxInReference *)local_18b0;
  uVar12 = 1;
  cfd::api::ElementsTransactionApi::FundRawTransaction
            ((ElementsTransactionApi *)in_stack_ffffffffffffef80,(string *)in_stack_ffffffffffffef78
             ,in_stack_ffffffffffffef70,in_stack_ffffffffffffef68,in_stack_ffffffffffffef60,
             in_stack_ffffffffffffefa0,in_stack_ffffffffffffefa8,(bool)in_stack_ffffffffffffef5f,
             (double)in_stack_ffffffffffffef50,in_stack_ffffffffffffefb8,in_stack_ffffffffffffefc0,
             in_stack_ffffffffffffefc8,in_stack_ffffffffffffefd0,in_stack_ffffffffffffefd8,
             in_stack_ffffffffffffefe0,in_stack_ffffffffffffefe8);
  std::__cxx11::string::~string((string *)local_1ef0);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_((AbstractTransactionController *)this_00);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1f00,"kExpTxData","ctx.GetHex().c_str()",
             "0200000000040a503dbd4f8f2b064c70e048b21f93fe4584174478abf5f44747932cd21da87c0000000000ffffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000ffffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000ffffffff020b0000000000000000000000000000000000000000000000000000000000000000000000ffffffff070100000000000000000000000000000000000000000000000000000000000000aa01000110d9316ec00003b86ca86f23bc47e6ae1eebf2dea191f0ab98b89e2d5b6e5e8de20631441caeaa1600144352a1a6e86311f22274f7ebb2746de21b09b15d0100000000000000000000000000000000000000000000000000000000000000bb010000000ba43b740003a9dda6bdef90309c4fb5fe9131e396e9f9b32dc1b8defea451f71e6af1127b1d1600148beaaac4654cf4ebd8e46ca5062b0e7fb3e7470c0100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b740003fef01583b95b37ee4f23d3673dfcc01faa4654272c289e8e3caa6aeb31f634741600144852255c0ff013e835689f30fb52508f89b6fbe20100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b7400037703a4ef463f044f462f35c4dece9d1f02d32681079c2c01cea4d6267dd782ef1600143159e9a1f6cdd588b6d5df65c3c7a190ecf0fba70100000000000000000000000000000000000000000000000000000000000000aa01000000000000026400000100000000000000000000000000000000000000000000000000000000000000bb01000000a2fb40580000160014a53be40113bb50f2b8b2d0bfea1e823e75632b5f0100000000000000000000000000000000000000000000000000000000000000aa01000000fd340d189c0016001478eb9fc2c9e1cdf633ecb646858ba862b21384ab00000000"
             ,pcVar6);
  std::__cxx11::string::~string(local_1f20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f00);
  if (!bVar1) {
    testing::Message::Message(&local_1f28);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x2cd8f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x326,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1f30,&local_1f28);
    testing::internal::AssertHelper::~AssertHelper(&local_1f30);
    testing::Message::~Message((Message *)0x2cd953);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2cd9ab);
  local_1f44 = 0x264;
  local_1f50 = cfd::core::Amount::GetSatoshiValue((Amount *)local_1df0);
  testing::internal::EqHelper<false>::Compare<int,long>
            (pcVar9,(char *)this_02,(int *)CONCAT44(in_stack_ffffffffffffdc3c,uVar12),
             (long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f40);
  if (!bVar1) {
    testing::Message::Message(&local_1f58);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x2cda79);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x327,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1f60,&local_1f58);
    testing::internal::AssertHelper::~AssertHelper(&local_1f60);
    testing::Message::~Message((Message *)0x2cdadc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2cdb34);
  local_1f78 = 2;
  local_1f80 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&stack0xffffffffffffe1f0);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (pcVar9,(char *)this_02,(unsigned_long *)CONCAT44(in_stack_ffffffffffffdc3c,uVar12),
             (unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f70);
  if (!bVar1) {
    testing::Message::Message(&local_1f88);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x2cdbf1);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x328,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1f90,&local_1f88);
    testing::internal::AssertHelper::~AssertHelper(&local_1f90);
    testing::Message::~Message((Message *)0x2cdc54);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2cdcac);
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffe1f0);
  if (sVar7 == 2) {
    cfd::core::Address::GetAddress_abi_cxx11_(&local_1fc0,&local_15f8);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffe1f0,1);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_1fa0,"addr1.GetAddress().c_str()",
               "append_txout_addresses[1].c_str()",pcVar6,pcVar8);
    std::__cxx11::string::~string((string *)&local_1fc0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1fa0);
    if (!bVar1) {
      testing::Message::Message(&local_1fc8);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x2cddd3);
      testing::internal::AssertHelper::AssertHelper
                (&local_1fd0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x32b,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1fd0,&local_1fc8);
      testing::internal::AssertHelper::~AssertHelper(&local_1fd0);
      testing::Message::~Message((Message *)0x2cde36);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2cde8e);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_2000,&local_17f8);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffe1f0,0);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_1fe0,"addr2.GetAddress().c_str()",
               "append_txout_addresses[0].c_str()",pcVar6,pcVar8);
    std::__cxx11::string::~string((string *)&local_2000);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1fe0);
    if (!bVar1) {
      testing::Message::Message(&local_2008);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x2cdf9d);
      testing::internal::AssertHelper::AssertHelper
                (&local_2010,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x32c,pcVar6);
      testing::internal::AssertHelper::operator=(&local_2010,&local_2008);
      testing::internal::AssertHelper::~AssertHelper(&local_2010);
      testing::Message::~Message((Message *)0x2ce000);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ce055);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_((AbstractTransactionController *)this_00);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_01,(string *)this_00);
  std::__cxx11::string::~string(local_20e8);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
            *)0x2ce0b9);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)this_02,(value_type *)CONCAT44(in_stack_ffffffffffffdc3c,uVar12));
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)this_02,(value_type *)CONCAT44(in_stack_ffffffffffffdc3c,uVar12));
  cfd::ConfidentialTransactionContext::CollectInputUtxo
            (in_stack_ffffffffffffe2e0,in_stack_ffffffffffffe2d8);
  cfd::ConfidentialTransactionContext::Blind
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_ffffffffffffdca4,in_stack_ffffffffffffdca0),
             (vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
              *)CONCAT44(in_stack_ffffffffffffdc9c,in_stack_ffffffffffffdc98),
             CONCAT17(in_stack_ffffffffffffdc97,in_stack_ffffffffffffdc90),
             (int)((ulong)in_stack_ffffffffffffdc88 >> 0x20),(int)in_stack_ffffffffffffdc88,
             in_stack_ffffffffffffdc80);
  cfd::core::ConfidentialTransaction::GetTxInList(&local_2120,&local_20c8);
  local_2108 = &local_2120;
  local_2128._M_current =
       (ConfidentialTxInReference *)
       std::
       vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
       ::begin((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                *)this_00);
  local_2130 = (ConfidentialTxInReference *)
               std::
               vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
               ::end((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                      *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                             *)this_01,
                            (__normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                             *)this_00), bVar1) {
    local_2138 = __gnu_cxx::
                 __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                 ::operator*(&local_2128);
    cfd::core::AbstractTxInReference::GetTxid(this_00);
    uVar2 = cfd::core::AbstractTxInReference::GetVout(&local_2138->super_AbstractTxInReference);
    cfd::core::OutPoint::OutPoint(&local_2160,&local_2180,uVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_21b8,
               "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",&local_21b9);
    cfd::core::Pubkey::Pubkey(&local_2198,&local_21b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2200,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
               &local_2201);
    cfd::core::Privkey::FromWif(&local_21e0,&local_2200,kTestnet,true);
    cfd::core::SigHashType::SigHashType(&local_2210);
    cfd::ConfidentialTransactionContext::SignWithKey
              (in_stack_ffffffffffffe200,in_stack_ffffffffffffe1f8,
               (Pubkey *)in_stack_ffffffffffffe1f0,in_stack_ffffffffffffe1e8,
               in_stack_ffffffffffffe1e0,(bool)in_stack_ffffffffffffe1df);
    cfd::core::Privkey::~Privkey((Privkey *)0x2ce32c);
    std::__cxx11::string::~string((string *)&local_2200);
    std::allocator<char>::~allocator((allocator<char> *)&local_2201);
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x2ce353);
    std::__cxx11::string::~string((string *)&local_21b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_21b9);
    cfd::core::OutPoint::~OutPoint((OutPoint *)0x2ce37a);
    cfd::core::Txid::~Txid((Txid *)0x2ce387);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
    ::operator++(&local_2128);
  }
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
             *)this_02);
  uVar2 = cfd::core::ConfidentialTransaction::GetVsize(&local_20c8);
  if (((uVar2 != 0x17e6) &&
      (uVar2 = cfd::core::ConfidentialTransaction::GetVsize(&local_20c8), uVar2 != 0x17e7)) &&
     (uVar2 = cfd::core::ConfidentialTransaction::GetVsize(&local_20c8), uVar2 != 0x17e8)) {
    local_2224 = 100;
    local_2228 = cfd::core::ConfidentialTransaction::GetVsize(&local_20c8);
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              (pcVar9,(char *)this_02,(int *)CONCAT44(in_stack_ffffffffffffdc3c,uVar12),
               (uint *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2220);
    if (!bVar1) {
      testing::Message::Message(&local_2230);
      pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)0x2ce5c7);
      testing::internal::AssertHelper::AssertHelper
                (&local_2238,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x33c,pcVar9);
      testing::internal::AssertHelper::operator=(&local_2238,&local_2230);
      testing::internal::AssertHelper::~AssertHelper(&local_2238);
      testing::Message::~Message((Message *)0x2ce624);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ce679);
  }
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
             *)this_02);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_01);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)this_01);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x2ce6c1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_02);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)this_02);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(this_01);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x2ce702);
  cfd::core::Address::~Address(&this_01->unblinded_address_);
  cfd::core::Address::~Address(&this_01->unblinded_address_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
          *)0x2ce729);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2ce736);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(this_01);
  cfd::core::Address::~Address(&this_01->unblinded_address_);
  cfd::core::Address::~Address(&this_01->unblinded_address_);
  cfd::core::Address::~Address(&this_01->unblinded_address_);
  cfd::core::Address::~Address(&this_01->unblinded_address_);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)this_01);
  std::__cxx11::string::~string(local_130);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x2ceab8);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_02);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_01);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_MinBits36) {
  static const char* const kExpTxData = "0200000000040a503dbd4f8f2b064c70e048b21f93fe4584174478abf5f44747932cd21da87c0000000000ffffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000ffffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000ffffffff020b0000000000000000000000000000000000000000000000000000000000000000000000ffffffff070100000000000000000000000000000000000000000000000000000000000000aa01000110d9316ec00003b86ca86f23bc47e6ae1eebf2dea191f0ab98b89e2d5b6e5e8de20631441caeaa1600144352a1a6e86311f22274f7ebb2746de21b09b15d0100000000000000000000000000000000000000000000000000000000000000bb010000000ba43b740003a9dda6bdef90309c4fb5fe9131e396e9f9b32dc1b8defea451f71e6af1127b1d1600148beaaac4654cf4ebd8e46ca5062b0e7fb3e7470c0100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b740003fef01583b95b37ee4f23d3673dfcc01faa4654272c289e8e3caa6aeb31f634741600144852255c0ff013e835689f30fb52508f89b6fbe20100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b7400037703a4ef463f044f462f35c4dece9d1f02d32681079c2c01cea4d6267dd782ef1600143159e9a1f6cdd588b6d5df65c3c7a190ecf0fba70100000000000000000000000000000000000000000000000000000000000000aa01000000000000026400000100000000000000000000000000000000000000000000000000000000000000bb01000000a2fb40580000160014a53be40113bb50f2b8b2d0bfea1e823e75632b5f0100000000000000000000000000000000000000000000000000000000000000aa01000000fd340d189c0016001478eb9fc2c9e1cdf633ecb646858ba862b21384ab00000000";

  ConfidentialTransactionContext tx(uint32_t{2}, uint32_t{0});
  std::vector<UtxoData> utxos;
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  std::string descMulti = "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))";

  try {
    utxos.resize(kFundCoinSelectElementsTestVector2.size());
    uint32_t i = 0;
    for (const auto& test_data : kFundCoinSelectElementsTestVector2) {
      Txid txid;
      if (!test_data.txid.empty()) {
        txid = Txid(test_data.txid);
      }
      utxos[i].txid = Txid(test_data.txid);
      utxos[i].vout = test_data.vout;
      utxos[i].amount = Amount(test_data.amount);
      utxos[i].asset = ConfidentialAssetId(test_data.asset);
      utxos[i].descriptor = test_data.descriptor;
      utxos[i].address_type = AddressType::kP2shP2wpkhAddress;
      ++i;
    }

    // add txout
    ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");
    Address set_addr1 = factory.CreateP2wpkhAddress(key.DerivePubkey(11).GetPubkey());
    Address set_addr2 = factory.CreateP2wpkhAddress(key.DerivePubkey(12).GetPubkey());
    Address set_addr3 = factory.CreateP2wpkhAddress(key.DerivePubkey(13).GetPubkey());
    Address set_addr4 = factory.CreateP2wpkhAddress(key.DerivePubkey(14).GetPubkey());
    ElementsConfidentialAddress ct_addr1 = ElementsConfidentialAddress(
        set_addr1, key.DerivePubkey(111).GetPubkey());
    ElementsConfidentialAddress ct_addr2 = ElementsConfidentialAddress(
        set_addr2, key.DerivePubkey(112).GetPubkey());
    ElementsConfidentialAddress ct_addr3 = ElementsConfidentialAddress(
        set_addr3, key.DerivePubkey(113).GetPubkey());
    ElementsConfidentialAddress ct_addr4 = ElementsConfidentialAddress(
        set_addr4, key.DerivePubkey(114).GetPubkey());
    tx.AddTxOut(ct_addr1, Amount(int64_t{300000000000000}), exp_dummy_asset_a);
    tx.AddTxOut(ct_addr2, Amount(int64_t{50000000000}), exp_dummy_asset_b);
    tx.AddTxOut(ct_addr3, Amount(int64_t{50000000000}), exp_dummy_asset_a);
    tx.AddTxOut(ct_addr4, Amount(int64_t{50000000000}), exp_dummy_asset_a);

    ConfidentialAssetId fee_asset = exp_dummy_asset_a;
    std::map<std::string, Amount> map_target_value;
    map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount(int64_t{0}));
    map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount(int64_t{0}));
    Address addr1 = factory.CreateP2wpkhAddress(key.DerivePubkey(1).GetPubkey());
    Address addr2 = factory.CreateP2wpkhAddress(key.DerivePubkey(2).GetPubkey());
    std::map<std::string, std::string> reserve_txout_address;
    reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), addr1.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), addr2.GetAddress());
    ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
        addr1, key.DerivePubkey(91).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
        addr2, key.DerivePubkey(92).GetPubkey());
    std::vector<ElementsUtxoAndOption> selected_txin_utxos;
    double fee_rate = 0.1;
    Amount estimate_fee;
    UtxoFilter filter;
    std::vector<std::string> append_txout_addresses;
    CoinSelectionOption option;
    option.InitializeConfidentialTxSizeInfo();
    option.SetEffectiveFeeBaserate(fee_rate);
    option.SetLongTermFeeBaserate(fee_rate);
    option.SetFeeAsset(fee_asset);
    option.SetBlindInfo(0, 36);

    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        tx.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kElementsRegtest);

    EXPECT_STREQ(kExpTxData, ctx.GetHex().c_str());
    EXPECT_EQ(612, estimate_fee.GetSatoshiValue());
    EXPECT_EQ(size_t{2}, append_txout_addresses.size());
    if (append_txout_addresses.size() == size_t{2})
    {
      EXPECT_STREQ(addr1.GetAddress().c_str(), append_txout_addresses[1].c_str());
      EXPECT_STREQ(addr2.GetAddress().c_str(), append_txout_addresses[0].c_str());
    }

    ConfidentialTransactionContext context(ctx.GetHex());
    std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
    ct_addrs.push_back(reserve_ct_addr1);
    ct_addrs.push_back(reserve_ct_addr2);
    context.CollectInputUtxo(utxos);
    context.Blind(&ct_addrs, 1, 0, 36);
    for (const auto& txin : context.GetTxInList()) {
      context.SignWithKey(OutPoint(txin.GetTxid(), txin.GetVout()),
          Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
          Privkey::FromWif(
              "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet));
    }
    if ((context.GetVsize() != 6118) && (context.GetVsize() != 6119) && (context.GetVsize() != 6120)) {
      EXPECT_EQ(100, context.GetVsize());
    }
    // EXPECT_STREQ("", context.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    return;
  }
}